

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Gia_ManDumpTests(Vec_Int_t *vTests,int nIter,char *pFileName)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  int iVar3;
  int iVar4;
  int iVar5;
  
  __stream = fopen(pFileName,"wb");
  iVar1 = vTests->nSize / nIter;
  if (vTests->nSize % nIter == 0) {
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    if (nIter < 1) {
      nIter = 0;
    }
    iVar4 = 0;
    for (iVar5 = 0; iVar5 != nIter; iVar5 = iVar5 + 1) {
      for (iVar3 = 0; iVar1 != iVar3; iVar3 = iVar3 + 1) {
        uVar2 = Vec_IntEntry(vTests,iVar4 + iVar3);
        fprintf(__stream,"%d",(ulong)uVar2);
      }
      fputc(10,__stream);
      iVar4 = iVar4 + iVar1;
    }
    fclose(__stream);
    return;
  }
  __assert_fail("Vec_IntSize(vTests) % nIter == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x32a,"void Gia_ManDumpTests(Vec_Int_t *, int, char *)");
}

Assistant:

void Gia_ManDumpTests( Vec_Int_t * vTests, int nIter, char * pFileName )
{
    FILE * pFile = fopen( pFileName, "wb" );
    int i, k, v, nVars = Vec_IntSize(vTests) / nIter;
    assert( Vec_IntSize(vTests) % nIter == 0 );
    for ( v = i = 0; i < nIter; i++, fprintf(pFile, "\n") )
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, "%d", Vec_IntEntry(vTests, v++) );
    fclose( pFile );
}